

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void __thiscall capnp::_::StructBuilder::clearAll(StructBuilder *this)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = this->dataSize;
  if (uVar2 == 1) {
    *(byte *)this->data = *this->data & 0xfd;
  }
  else if (7 < uVar2) {
    memset(this->data,0,(ulong)(uVar2 >> 3));
  }
  uVar1 = this->pointerCount;
  if (uVar1 != 0) {
    lVar3 = 0;
    do {
      WireHelpers::zeroObject
                (this->segment,this->capTable,
                 (WirePointer *)((long)&(this->pointers->offsetAndKind).value + lVar3));
      lVar3 = lVar3 + 8;
    } while ((ulong)uVar1 * 8 != lVar3);
  }
  if (this->pointerCount != 0) {
    memset(this->pointers,0,(ulong)this->pointerCount << 3);
    return;
  }
  return;
}

Assistant:

void StructBuilder::clearAll() {
  if (dataSize == ONE * BITS) {
    setDataField<bool>(ONE * ELEMENTS, false);
  } else {
    WireHelpers::zeroMemory(reinterpret_cast<byte*>(data), dataSize / BITS_PER_BYTE);
  }

  for (auto i: kj::zeroTo(pointerCount)) {
    WireHelpers::zeroObject(segment, capTable, pointers + i);
  }
  WireHelpers::zeroMemory(pointers, pointerCount);
}